

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageLite::ParseFromArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  LogMessage *other;
  MessageLite *message;
  undefined1 uVar2;
  CodedInputStream input;
  LogFinisher local_b1;
  string local_b0;
  CodedInputStream local_90;
  LogMessage local_40;
  
  local_90.input_ = (ZeroCopyInputStream *)0x0;
  local_90.buffer_end_ = (uint8 *)((long)data + (long)size);
  local_90.overflow_bytes_ = 0;
  local_90.last_tag_ = 0;
  local_90.legitimate_message_end_ = false;
  local_90.aliasing_enabled_ = false;
  local_90.buffer_size_after_limit_ = 0;
  local_90.total_bytes_limit_ = 0x4000000;
  local_90.total_bytes_warning_threshold_ = 0x2000000;
  local_90.recursion_depth_ = 0;
  local_90.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_90.extension_pool_ = (DescriptorPool *)0x0;
  local_90.extension_factory_ = (MessageFactory *)0x0;
  local_90.buffer_ = (uint8 *)data;
  local_90.total_bytes_read_ = size;
  local_90.current_limit_ = size;
  (*this->_vptr_MessageLite[4])();
  iVar1 = (*this->_vptr_MessageLite[8])(this,&local_90);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_MessageLite[5])(this);
    if ((char)iVar1 != '\0') {
      uVar2 = local_90.legitimate_message_end_;
      goto LAB_00217052;
    }
    message = (MessageLite *)0x7b;
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message_lite.cc"
               ,0x7b);
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)"parse",(char *)this,message);
    other = internal::LogMessage::operator<<(&local_40,&local_b0);
    internal::LogFinisher::operator=(&local_b1,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage(&local_40);
  }
  uVar2 = 0;
LAB_00217052:
  io::CodedInputStream::~CodedInputStream(&local_90);
  return (bool)uVar2;
}

Assistant:

bool MessageLite::ParseFromArray(const void* data, int size) {
  return InlineParseFromArray(data, size, this);
}